

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O0

int func_getargs(void)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  ushort **ppuVar4;
  uchar *puVar5;
  int local_38;
  int local_34;
  int x;
  int i;
  int flag;
  int space;
  int level;
  int arg;
  char *line;
  char *ptr;
  char c;
  
  if (func_idx == 7) {
    error("Too many nested function calls!");
  }
  else {
    while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)*expr] & 0x2000) != 0) {
      expr = expr + 1;
    }
    puVar5 = expr + 1;
    uVar1 = *expr;
    expr = puVar5;
    if (uVar1 == '(') {
      _level = (char *)0x0;
      line = (char *)(func_arg + func_idx);
      space = 0;
      for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
        func_arg[func_idx][local_34][0] = '\0';
      }
LAB_0010e8c7:
      do {
        while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)*expr] & 0x2000) != 0) {
          expr = expr + 1;
        }
        puVar5 = expr + 1;
        ptr._3_1_ = *expr;
        expr = puVar5;
        if (ptr._3_1_ == '\0') {
LAB_0010e9a1:
          error("Syntax error in function call!");
          return 0;
        }
        if (ptr._3_1_ == ')') {
          return 1;
        }
        if (ptr._3_1_ != ',') {
          if (ptr._3_1_ != ';') {
            bVar3 = false;
            flag = 0;
            bVar2 = false;
            local_34 = 0;
            local_38 = 0;
LAB_0010e9e8:
            while (ptr._3_1_ == '\0') {
              if (!bVar2) goto LAB_0010ec34;
              bVar2 = false;
              ptr._3_1_ = *expr;
              expr = expr + 1;
            }
            if (ptr._3_1_ == ';') goto LAB_0010ec34;
            if (ptr._3_1_ == ',') {
              if (flag == 0) goto LAB_0010ec34;
            }
            else {
              if (ptr._3_1_ == '\\') {
                if (func_idx == 0) {
                  error("Syntax error!");
                  return 0;
                }
                uVar1 = *expr;
                if (((char)uVar1 < '1') || ('9' < (char)uVar1)) {
                  expr = expr + 1;
                  error("Invalid function argument index!");
                  return 0;
                }
                bVar2 = true;
                ptr._3_1_ = func_arg[func_idx + -1][(char)uVar1 + -0x31][0];
                expr = expr + 1;
                _level = func_arg[func_idx + -1][(char)uVar1 + -0x31] + 1;
                goto LAB_0010e9e8;
              }
              if (ptr._3_1_ == '(') {
                flag = flag + 1;
              }
              else if (ptr._3_1_ == ')') {
                if (flag == 0) goto LAB_0010ec34;
                flag = flag + -1;
              }
            }
            if (bVar3) {
              if (ptr._3_1_ != ' ') {
                while (local_34 < local_38) {
                  line[local_34] = ' ';
                  local_34 = local_34 + 1;
                }
                line[local_34] = ptr._3_1_;
                bVar3 = false;
                local_34 = local_34 + 1;
              }
            }
            else if (ptr._3_1_ == ' ') {
              bVar3 = true;
            }
            else {
              line[local_34] = ptr._3_1_;
              local_34 = local_34 + 1;
            }
            if (local_34 == 0x50) {
              error("Invalid function argument length!");
              return 0;
            }
            local_38 = local_38 + 1;
            if (bVar2) {
              ptr._3_1_ = *_level;
              _level = _level + 1;
            }
            else {
              ptr._3_1_ = *expr;
              expr = expr + 1;
            }
            goto LAB_0010e9e8;
          }
          goto LAB_0010e9a1;
        }
        space = space + 1;
        line = func_arg[func_idx][space];
      } while (space != 9);
      error("Too many arguments for a function!");
    }
  }
  return 0;
LAB_0010ec34:
  line[local_34] = '\0';
  expr = expr + -1;
  goto LAB_0010e8c7;
}

Assistant:

int
func_getargs(void)
{
	char c, *ptr, *line;
	int arg, level, space, flag;
	int i, x;

	/* can not nest too much macros */
	if (func_idx == 7) {
		error("Too many nested function calls!");
		return (0);
	}

	/* skip spaces */
	while (isspace(*expr))
		expr++;

	/* function args must be enclosed in parenthesis */
	if (*expr++ != '(')
		return (0);

	/* initialize args */
    line = NULL;
	ptr  = func_arg[func_idx][0];
	arg  = 0;

	for (i = 0; i < 9; i++)
		func_arg[func_idx][i][0] = '\0';

	/* get args one by one */
	for (;;) {
		/* skip spaces */
		while (isspace(*expr))
			expr++;

		c = *expr++;
		switch (c) {
		/* empty arg */
		case ',':
			arg++;
			ptr = func_arg[func_idx][arg];
			if (arg == 9) {
				error("Too many arguments for a function!");
				return (0);
			}
			break;

		/* end of line */	
		case ';':
		case '\0':
			error("Syntax error in function call!");
			return (0);

		/* end of function */
		case ')':
			return (1);

		/* arg */
		default:
			space = 0;
			level = 0;
			flag = 0;
			i = 0;
			x = 0;
			for (;;) {
				if (c == '\0') {
					if (flag == 0)
						break;
					else {
						flag = 0;
						c = *expr++;
						continue;
					}
				}
				else if (c == ';') {
					break;
				}
				else if (c == ',') {
					if (level == 0)
						break;
				}
				else if (c == '\\') {
					if (func_idx == 0) {
						error("Syntax error!");
						return (0);
					}
					c = *expr++;
					if (c < '1' || c > '9') {
						error("Invalid function argument index!");
						return (0);
					}
					line = func_arg[func_idx - 1][c - '1'];
					flag = 1;
					c = *line++;
					continue;
				}
				else if (c == '(') {
					level++;
				}
				else if (c == ')') {
					if (level == 0)
						break;
					level--;
				}
				if (space) {
					if (c != ' ') {
						while (i < x)
							ptr[i++] = ' ';
						ptr[i++] = c;
						space = 0;
					}
				}
				else if (c == ' ') {
					space = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Invalid function argument length!");
					return (0);
				}
				x++;
				if (flag)
					c = *line++;
				else
					c = *expr++;
			}
			ptr[i] = '\0';
			expr--;
			break;
		}
	}
}